

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopFunctionScope(cmMakefile *this,bool reportError)

{
  cmGlobalGenerator *this_00;
  cmFileLockPool *this_01;
  bool reportError_local;
  cmMakefile *this_local;
  
  PopPolicy(this);
  PopSnapshot(this,reportError);
  PopFunctionBlockerBarrier(this,reportError);
  this_00 = GetGlobalGenerator(this);
  this_01 = cmGlobalGenerator::GetFileLockPool(this_00);
  cmFileLockPool::PopFunctionScope(this_01);
  PopLoopBlockBarrier(this);
  return;
}

Assistant:

void cmMakefile::PopFunctionScope(bool reportError)
{
  this->PopPolicy();

  this->PopSnapshot(reportError);

  this->PopFunctionBlockerBarrier(reportError);

#if !defined(CMAKE_BOOTSTRAP)
  this->GetGlobalGenerator()->GetFileLockPool().PopFunctionScope();
#endif

  this->PopLoopBlockBarrier();
}